

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_set.hpp
# Opt level: O0

set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> * __thiscall
burst::make_set<unsigned_int,boost::integer_range<unsigned_int>>
          (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,burst *this,integer_range<unsigned_int> *values)

{
  integer_iterator<unsigned_int> __first;
  integer_iterator<unsigned_int> __last;
  integer_range<unsigned_int> *values_local;
  
  __first = std::begin<boost::integer_range<unsigned_int>>((integer_range<unsigned_int> *)this);
  __last = std::end<boost::integer_range<unsigned_int>>((integer_range<unsigned_int> *)this);
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<boost::range_detail::integer_iterator<unsigned_int>>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
             __return_storage_ptr__,__first,__last);
  return __return_storage_ptr__;
}

Assistant:

auto make_set (InputRange && values)
    {
        using std::begin;
        using std::end;
        return
            std::set<Value>
            (
                begin(std::forward<InputRange>(values)),
                end(std::forward<InputRange>(values))
            );
    }